

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  cmMessenger *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  bool bVar4;
  bool bVar5;
  string local_2f8;
  undefined4 local_2d4;
  string local_2d0;
  cmListFileContext local_2b0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_240;
  undefined1 local_230 [8];
  cmListFileBacktrace lfbt;
  undefined1 local_210 [8];
  cmListFileContext lfc;
  ostringstream m;
  Delimiter local_24;
  bool isError;
  cmListFileLexer_Token *pcStack_20;
  Delimiter delim_local;
  cmListFileLexer_Token *token_local;
  cmListFileParser *this_local;
  
  local_24 = delim;
  pcStack_20 = token;
  token_local = (cmListFileLexer_Token *)this;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char*&,cmListFileArgument::Delimiter&,int&>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
             &this->FunctionArguments,&token->text,&local_24,&token->line);
  if (this->Separation == SeparationOkay) {
    this_local._7_1_ = 1;
  }
  else {
    bVar4 = this->Separation == SeparationError;
    bVar5 = local_24 == Bracket;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &lfc.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged);
    cmListFileContext::cmListFileContext((cmListFileContext *)local_210);
    std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
    lfc.FilePath.field_2._8_8_ = SEXT48(pcStack_20->line);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_230,&this->Backtrace);
    cmListFileContext::cmListFileContext(&local_2b0,(cmListFileContext *)local_210);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              (&local_240,(cmListFileContext *)local_230);
    cmListFileBacktrace::operator=
              ((cmListFileBacktrace *)local_230,(cmListFileBacktrace *)&local_240);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_240);
    cmListFileContext::~cmListFileContext(&local_2b0);
    poVar3 = std::operator<<((ostream *)
                             &lfc.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged,"Syntax ");
    pcVar2 = "CMake Warning";
    if (bVar4 || bVar5) {
      pcVar2 = "CMake Error";
    }
    poVar3 = std::operator<<(poVar3,pcVar2 + 6);
    poVar3 = std::operator<<(poVar3," in cmake code at ");
    poVar3 = std::operator<<(poVar3,"column ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcStack_20->column);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"Argument not separated from preceding token by whitespace.");
    bVar4 = !bVar4 && !bVar5;
    if (bVar4) {
      pcVar1 = this->Messenger;
      std::__cxx11::ostringstream::str();
      cmMessenger::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2f8,(cmListFileBacktrace *)local_230);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
    else {
      pcVar1 = this->Messenger;
      std::__cxx11::ostringstream::str();
      cmMessenger::IssueMessage(pcVar1,FATAL_ERROR,&local_2d0,(cmListFileBacktrace *)local_230);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    local_2d4 = 1;
    this_local._7_1_ = bVar4;
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_230);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_210);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &lfc.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  this->FunctionArguments.emplace_back(token->text, delim, token->line);
  if (this->Separation == SeparationOkay) {
    return true;
  }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = token->line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);

  m << "Syntax " << (isError ? "Error" : "Warning") << " in cmake code at "
    << "column " << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  /* clang-format on */
  if (isError) {
    this->Messenger->IssueMessage(MessageType::FATAL_ERROR, m.str(), lfbt);
    return false;
  }
  this->Messenger->IssueMessage(MessageType::AUTHOR_WARNING, m.str(), lfbt);
  return true;
}